

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupper.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = toupper(0x61);
  if (iVar1 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1a,"toupper( \'a\' ) == \'A\'");
  }
  iVar1 = toupper(0x7a);
  if (iVar1 != 0x5a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1b,"toupper( \'z\' ) == \'Z\'");
  }
  iVar1 = toupper(0x41);
  if (iVar1 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1c,"toupper( \'A\' ) == \'A\'");
  }
  iVar1 = toupper(0x5a);
  if (iVar1 != 0x5a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1d,"toupper( \'Z\' ) == \'Z\'");
  }
  iVar1 = toupper(0x40);
  if (iVar1 != 0x40) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1e,"toupper( \'@\' ) == \'@\'");
  }
  iVar1 = toupper(0x5b);
  if (iVar1 != 0x5b) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/toupper.c, line %d - %s\n"
           ,0x1f,"toupper( \'[\' ) == \'[\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( toupper( 'a' ) == 'A' );
    TESTCASE( toupper( 'z' ) == 'Z' );
    TESTCASE( toupper( 'A' ) == 'A' );
    TESTCASE( toupper( 'Z' ) == 'Z' );
    TESTCASE( toupper( '@' ) == '@' );
    TESTCASE( toupper( '[' ) == '[' );
    return TEST_RESULTS;
}